

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::add_test_case(QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                *this,runtime_type *i_type,PutTestCase i_put_func,
               ReentrantPutTestCase i_reentrant_put_func,ConsumeTestCase i_consume_func,
               ReentrantConsumeTestCase i_reentrant_consume_func)

{
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  pair<std::__detail::_Node_iterator<std::pair<const_density::runtime_type<>,_unsigned_long>,_false,_false>,_bool>
  pVar1;
  _func_void_reentrant_consume_operation_ptr_conflict2 *local_38;
  _func_void_consume_operation_ptr_conflict2 *local_30;
  _func_reentrant_put_transaction<void>_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr_conflict1
  *local_28;
  _func_bool_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr
  *local_20;
  tuple_type *local_18;
  long local_10;
  
  local_10 = *(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3;
  local_18 = i_type->m_feature_table;
  local_38 = i_reentrant_consume_func;
  local_30 = i_consume_func;
  local_28 = i_reentrant_put_func;
  local_20 = i_put_func;
  pVar1 = std::
          _Hashtable<density::runtime_type<>,std::pair<density::runtime_type<>const,unsigned_long>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<density::runtime_type<>>,std::hash<density::runtime_type<>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<density::runtime_type<>,unsigned_long>>
                    ((_Hashtable<density::runtime_type<>,std::pair<density::runtime_type<>const,unsigned_long>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<density::runtime_type<>>,std::hash<density::runtime_type<>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 8));
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    detail::assert_failed<>
              ("result.second",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x48);
  }
  __position._M_current =
       *(_func_bool_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr
         ***)(this + 0x48);
  if (__position._M_current ==
      *(_func_bool_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr
        ***)(this + 0x50)) {
    std::
    vector<bool(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&),std::allocator<bool(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&)>>
    ::
    _M_realloc_insert<bool(*const&)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&)>
              ((vector<bool(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&),std::allocator<bool(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&)>>
                *)(this + 0x40),__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    *(long *)(this + 0x48) = *(long *)(this + 0x48) + 8;
  }
  __position_00._M_current =
       *(_func_reentrant_put_transaction<void>_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr_conflict1
         ***)(this + 0x78);
  if (__position_00._M_current ==
      *(_func_reentrant_put_transaction<void>_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr_conflict1
        ***)(this + 0x80)) {
    std::
    vector<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_put_transaction<void>(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&),std::allocator<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_put_transaction<void>(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&)>>
    ::
    _M_realloc_insert<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_put_transaction<void>(*const&)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&)>
              ((vector<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_put_transaction<void>(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&),std::allocator<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_put_transaction<void>(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>&,density_tests::EasyRandom&)>>
                *)(this + 0x70),__position_00,&local_28);
  }
  else {
    *__position_00._M_current = local_28;
    *(long *)(this + 0x78) = *(long *)(this + 0x78) + 8;
  }
  __position_01._M_current = *(_func_void_consume_operation_ptr_conflict2 ***)(this + 0x60);
  if (__position_01._M_current == *(_func_void_consume_operation_ptr_conflict2 ***)(this + 0x68)) {
    std::
    vector<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation_const&),std::allocator<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation_const&)>>
    ::
    _M_realloc_insert<void(*const&)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation_const&)>
              ((vector<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation_const&),std::allocator<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation_const&)>>
                *)(this + 0x58),__position_01,&local_30);
  }
  else {
    *__position_01._M_current = local_30;
    *(long *)(this + 0x60) = *(long *)(this + 0x60) + 8;
  }
  __position_02._M_current =
       *(_func_void_reentrant_consume_operation_ptr_conflict2 ***)(this + 0x90);
  if (__position_02._M_current ==
      *(_func_void_reentrant_consume_operation_ptr_conflict2 ***)(this + 0x98)) {
    std::
    vector<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation_const&),std::allocator<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation_const&)>>
    ::
    _M_realloc_insert<void(*const&)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation_const&)>
              ((vector<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation_const&),std::allocator<void(*)(density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation_const&)>>
                *)(this + 0x88),__position_02,&local_38);
  }
  else {
    *__position_02._M_current = local_38;
    *(long *)(this + 0x90) = *(long *)(this + 0x90) + 8;
  }
  return;
}

Assistant:

void add_test_case(
          const typename QUEUE::runtime_type & i_type,
          PutTestCase                          i_put_func,
          ReentrantPutTestCase                 i_reentrant_put_func,
          ConsumeTestCase                      i_consume_func,
          ReentrantConsumeTestCase             i_reentrant_consume_func)
        {
            auto result = m_element_types.insert(std::make_pair(i_type, m_put_cases.size()));
            DENSITY_TEST_ASSERT(result.second);

            m_put_cases.push_back(i_put_func);
            m_reentrant_put_cases.push_back(i_reentrant_put_func);
            m_consume_cases.push_back(i_consume_func);
            m_reentrant_consume_cases.push_back(i_reentrant_consume_func);
        }